

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O0

void __thiscall capnp::SchemaParser::ModuleImpl::~ModuleImpl(ModuleImpl *this)

{
  ModuleImpl *this_local;
  
  kj::Lazy<kj::Vector<unsigned_int>_>::~Lazy(&this->lineBreaks);
  kj::Own<const_capnp::SchemaFile,_std::nullptr_t>::~Own(&this->file);
  return;
}

Assistant:

class SchemaParser::ModuleImpl final: public compiler::Module {
public:
  ModuleImpl(const SchemaParser& parser, kj::Own<const SchemaFile>&& file)
      : parser(parser), file(kj::mv(file)) {}

  kj::StringPtr getSourceName() override {
    return file->getDisplayName();
  }

  Orphan<compiler::ParsedFile> loadContent(Orphanage orphanage) override {
    kj::Array<const char> content = file->readContent();

    lineBreaks.get([&](kj::SpaceFor<kj::Vector<uint>>& space) {
      auto vec = space.construct(content.size() / 40);
      vec->add(0);
      for (const char* pos = content.begin(); pos < content.end(); ++pos) {
        if (*pos == '\n') {
          vec->add(pos + 1 - content.begin());
        }
      }
      return vec;
    });

    MallocMessageBuilder lexedBuilder;
    auto statements = lexedBuilder.initRoot<compiler::LexedStatements>();
    compiler::lex(content, statements, *this);

    auto parsed = orphanage.newOrphan<compiler::ParsedFile>();
    compiler::parseFile(statements.getStatements(), parsed.get(), *this, parser.fileIdsRequired);
    return parsed;
  }

  kj::Maybe<Module&> importRelative(kj::StringPtr importPath) override {
    KJ_IF_SOME(importedFile, file->import(importPath)) {
      return parser.getModuleImpl(kj::mv(importedFile));
    } else {
      return kj::none;
    }
  }

  kj::Maybe<kj::Array<const byte>> embedRelative(kj::StringPtr embedPath) override {
    KJ_IF_SOME(importedFile, file->import(embedPath)) {
      return importedFile->readContent().releaseAsBytes();
    } else {
      return kj::none;
    }